

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Biquad.cpp
# Opt level: O0

complex_t __thiscall Iir::Biquad::response(Biquad *this,double normalizedFrequency)

{
  Biquad *in_RDI;
  double in_XMM0_Qa;
  complex<double> *__z;
  undefined4 uVar1;
  undefined4 uVar2;
  complex<double> cVar3;
  complex_t cb;
  complex_t ct;
  complex_t cbot;
  complex_t ch;
  complex_t czn2;
  complex_t czn1;
  double w;
  double b2;
  double b1;
  double b0;
  double a2;
  double a1;
  double a0;
  double *in_stack_fffffffffffffea8;
  double __r;
  double *in_stack_fffffffffffffeb0;
  double __i;
  complex<double> *in_stack_fffffffffffffec0;
  complex<double> *c1;
  complex<double> *pcVar4;
  complex<double> *pcVar5;
  undefined1 local_d8 [16];
  complex<double> local_c8;
  complex<double> local_b8;
  complex<double> local_a8;
  double local_98;
  undefined8 local_90;
  complex<double> local_88;
  undefined4 local_78;
  uint uStack_74;
  undefined8 local_70;
  undefined8 local_60;
  undefined8 local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  
  local_20 = in_XMM0_Qa;
  local_28 = getA0(in_RDI);
  local_30 = getA1(in_RDI);
  local_38 = getA2(in_RDI);
  local_40 = getB0(in_RDI);
  local_48 = getB1(in_RDI);
  local_50 = getB2(in_RDI);
  local_20 = local_20 * 6.283185307179586;
  local_70 = 0x3ff0000000000000;
  uVar1 = 0;
  uVar2 = 0x80000000;
  local_58._0_4_ = SUB84(local_20,0);
  local_58._4_4_ = (uint)((ulong)local_20 >> 0x20);
  uStack_74 = local_58._4_4_ ^ 0x80000000;
  local_78 = (undefined4)local_58;
  local_58 = local_20;
  std::polar<double>(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  local_60 = CONCAT44(uVar2,uVar1);
  local_90 = 0x3ff0000000000000;
  uVar1 = 0;
  uVar2 = 0xc0000000;
  local_98 = local_58 * -2.0;
  std::polar<double>(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  local_88._M_value._12_4_ = uVar2;
  local_88._M_value._8_4_ = uVar1;
  __r = 1.0;
  __i = 0.0;
  std::complex<double>::complex(&local_a8,1.0,0.0);
  std::complex<double>::complex(&local_b8,__r,__i);
  pcVar4 = &local_c8;
  std::complex<double>::complex(pcVar4,local_40 / local_28,__i);
  pcVar5 = (complex<double> *)local_d8;
  std::complex<double>::complex(pcVar5,__r,__i);
  uVar1 = SUB84(local_28,0);
  uVar2 = (undefined4)((ulong)local_28 >> 0x20);
  addmul<double,double>(pcVar5,(double)pcVar4,in_stack_fffffffffffffec0);
  local_c8._M_value._12_4_ = uVar2;
  local_c8._M_value._8_4_ = uVar1;
  uVar1 = SUB84(local_28,0);
  uVar2 = (undefined4)((ulong)local_28 >> 0x20);
  c1 = &local_88;
  addmul<double,double>(pcVar5,(double)pcVar4,c1);
  local_c8._M_value._12_4_ = uVar2;
  local_c8._M_value._8_4_ = uVar1;
  uVar1 = SUB84(local_28,0);
  uVar2 = (undefined4)((ulong)local_28 >> 0x20);
  addmul<double,double>(pcVar5,(double)pcVar4,c1);
  local_d8._12_4_ = uVar2;
  local_d8._8_4_ = uVar1;
  uVar1 = SUB84(local_28,0);
  uVar2 = (undefined4)((ulong)local_28 >> 0x20);
  addmul<double,double>(pcVar5,(double)pcVar4,c1);
  pcVar4 = (complex<double> *)CONCAT44(uVar2,uVar1);
  pcVar5 = __z;
  local_d8._8_8_ = pcVar4;
  std::complex<double>::operator*=(pcVar4,__z);
  std::complex<double>::operator*=(pcVar4,pcVar5);
  cVar3 = std::operator/((complex<double> *)in_RDI,(complex<double> *)0x103048);
  return (complex_t)cVar3._M_value;
}

Assistant:

complex_t Biquad::response (double normalizedFrequency) const
	{
		const double a0 = getA0 ();
		const double a1 = getA1 ();
		const double a2 = getA2 ();
		const double b0 = getB0 ();
		const double b1 = getB1 ();
		const double b2 = getB2 ();

		const double w = 2 * doublePi * normalizedFrequency;
		const complex_t czn1 = std::polar (1., -w);
		const complex_t czn2 = std::polar (1., -2 * w);
		complex_t ch (1);
		complex_t cbot (1);

		complex_t ct (b0/a0);
		complex_t cb (1);
		ct = addmul (ct, b1/a0, czn1);
		ct = addmul (ct, b2/a0, czn2);
		cb = addmul (cb, a1/a0, czn1);
		cb = addmul (cb, a2/a0, czn2);
		ch   *= ct;
		cbot *= cb;

		return ch / cbot;
	}